

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_converter.h
# Opt level: O0

bool date::date_converter<date::rfc3339,_long,_void>::to_parts(time_t timepoint,parts *parts)

{
  seconds_count sVar1;
  date_time dVar2;
  year_type local_30;
  month_type mStack_2e;
  day_type dStack_2d;
  hour_type local_2c;
  minute_type mStack_2b;
  date_time dt;
  seconds_count epoch_offset;
  parts *parts_local;
  time_t timepoint_local;
  
  calendar_helper::date_time::date_time(&dt,0x7b2,'\x01','\x01','\0','\0','\0');
  sVar1 = calendar_helper::to_seconds_count(&dt);
  dVar2 = calendar_helper::from_seconds_count(sVar1 + timepoint);
  local_30 = dVar2.super_date.year;
  parts->year = local_30;
  mStack_2e = dVar2.super_date.month;
  parts->month = mStack_2e;
  dStack_2d = dVar2.super_date.day;
  parts->day = dStack_2d;
  local_2c = dVar2.super_time.hour;
  parts->hour = local_2c;
  mStack_2b = dVar2.super_time.minute;
  parts->minute = mStack_2b;
  parts->second = dVar2.super_time.second;
  parts->nanosecond = 0;
  parts->offset_in_minutes = 0;
  return true;
}

Assistant:

static bool to_parts(std::time_t timepoint, rfc3339::parts& parts)
    {
        using date_time = calendar_helper::date_time;
        const auto epoch_offset = calendar_helper::to_seconds_count(date_time{ 1970, 1, 1, 0, 0, 0 });
        const auto dt = calendar_helper::from_seconds_count(epoch_offset + timepoint);
        parts.year     = dt.year;
        parts.month    = dt.month;
        parts.day      = dt.day;
        parts.hour     = dt.hour;
        parts.minute   = dt.minute;
        parts.second   = dt.second;
        parts.nanosecond        = 0;
        parts.offset_in_minutes = 0;
        return true;
    }